

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# git-identity.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  char *pcVar6;
  long *plVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  string *psVar11;
  reference pbVar12;
  pointer pbVar13;
  undefined1 auVar14 [8];
  size_t sVar15;
  long *plVar16;
  size_type *psVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  uint uVar19;
  _Alloc_hider __s;
  long lVar20;
  string choiceStr;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  json;
  iterator result_1;
  string email;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __begin2;
  value_type identity;
  string homepath;
  ifstream jsonFile;
  ulong *local_488;
  ulong local_480;
  undefined1 local_478 [8];
  undefined1 local_470 [8];
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [8];
  json_value local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  long lStack_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  undefined1 local_390 [24];
  primitive_iterator_t local_378;
  _Alloc_hider local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  undefined1 local_320 [24];
  primitive_iterator_t pStack_308;
  size_t local_300;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  undefined1 local_2a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  long *local_278;
  long local_270;
  long local_268 [2];
  _Any_data local_258;
  code *local_248;
  undefined8 uStack_240;
  _Rb_tree_node_base local_238 [7];
  undefined8 auStack_150 [36];
  
  lVar20 = (long)local_238 + 0x10;
  local_238[0]._0_8_ = lVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"config --local user.name","")
  ;
  git((string *)local_470);
  if (local_238[0]._0_8_ != lVar20) {
    operator_delete((void *)local_238[0]._0_8_,(long)local_238[0]._M_left + 1);
  }
  local_238[0]._0_8_ = lVar20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"config --local user.email","");
  git((string *)local_478);
  if (local_238[0]._0_8_ != lVar20) {
    operator_delete((void *)local_238[0]._0_8_,(long)local_238[0]._M_left + 1);
  }
  if ((argc < 2) || (iVar5 = strcmp(argv[1],"check"), iVar5 != 0)) {
    pcVar6 = getenv("HOME");
    std::__cxx11::string::string((string *)&local_278,pcVar6,(allocator *)local_238);
    local_390._0_8_ =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)(local_390 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_390,local_278,local_270 + (long)local_278);
    std::__cxx11::string::append(local_390);
    plVar7 = (long *)std::__cxx11::string::append(local_390);
    pbVar13 = (pointer)(plVar7 + 2);
    if ((pointer)*plVar7 == pbVar13) {
      local_320._16_8_ = *(undefined8 *)&pbVar13->m_type;
      pStack_308.m_it = plVar7[3];
      local_320._0_8_ = (pointer)(local_320 + 0x10);
    }
    else {
      local_320._16_8_ = *(undefined8 *)&pbVar13->m_type;
      local_320._0_8_ = (pointer)*plVar7;
    }
    local_320._8_8_ = plVar7[1];
    *plVar7 = (long)pbVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::ifstream::ifstream(local_238,(string *)local_320,_S_in);
    if ((pointer)local_320._0_8_ != (pointer)(local_320 + 0x10)) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
    }
    if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)local_390._0_8_ !=
        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)(local_390 + 0x10)) {
      operator_delete((void *)local_390._0_8_,(ulong)(local_390._16_8_ + 1));
    }
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      main_cold_1();
    }
    else {
      local_320._8_8_ = operator_new(0x28);
      ((_Base_ptr)local_320._8_8_)->_M_parent = (_Base_ptr)0x100000001;
      *(undefined ***)local_320._8_8_ = &PTR___Sp_counted_ptr_inplace_00118b28;
      local_320._0_8_ = &((_Base_ptr)local_320._8_8_)->_M_left;
      ((_Base_ptr)local_320._8_8_)->_M_left = (_Base_ptr)&PTR_get_character_00118ba0;
      ((_Base_ptr)local_320._8_8_)->_M_right = local_238;
      *(undefined8 *)(local_320._8_8_ + 0x20) =
           *(undefined8 *)((long)auStack_150 + (long)*(_Base_ptr *)(local_238[0]._0_8_ + -0x18));
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      local_248 = (code *)0x0;
      uStack_240 = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_448,(input_adapter *)local_320,(parser_callback_t *)&local_258,true);
      if (local_248 != (code *)0x0) {
        (*local_248)(&local_258,&local_258,__destroy_functor);
      }
      if ((_Base_ptr)local_320._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._8_8_);
      }
      local_480 = 0;
      local_488 = (ulong *)0x0;
      while( true ) {
        uVar8 = (ulong)local_448[0];
        if (local_448[0] != null) {
          if (local_448[0] == object) {
            uVar8 = ((local_440.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          }
          else if (local_448[0] == array) {
            uVar8 = (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          else {
            uVar8 = 1;
          }
        }
        if (uVar8 <= local_488) break;
        pvVar9 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_448,(size_type)local_488);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)pvVar9,"user.name");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
                   pvVar10);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)pvVar9,"user.email");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_418,pvVar10);
        if (((local_470 != (undefined1  [8])0x0) && (local_478 != (undefined1  [8])0x0)) &&
           (local_468._8_8_ == *(size_type *)((long)local_470 + 8))) {
          auVar14 = local_478;
          if (local_468._8_8_ != 0) {
            local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_478;
            iVar5 = bcmp((void *)local_468._0_8_,*(void **)local_470,local_468._8_8_);
            auVar14 = (undefined1  [8])local_2b0;
            if (iVar5 != 0) goto LAB_00103c69;
          }
          if ((local_418._M_string_length ==
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar14)->
               _M_string_length) &&
             ((local_418._M_string_length == 0 ||
              (iVar5 = bcmp(local_418._M_dataplus._M_p,
                            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auVar14)->_M_dataplus)._M_p,local_418._M_string_length), iVar5 == 0))))
          {
            local_480 = (long)local_488 + 1;
          }
        }
LAB_00103c69:
        local_488 = (ulong *)((long)local_488 + 1);
        printf("(%zu) %s <%s>\n",local_488,local_468._0_8_);
        local_390._8_8_ = (_Base_ptr)0x0;
        local_390._16_8_ =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x0;
        local_378.m_it = -0x8000000000000000;
        local_390._0_8_ = pvVar9;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)local_390);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_320,
                   (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)local_390);
        local_438._M_string_length = 0;
        local_438.field_2._M_allocated_capacity = 0;
        local_438.field_2._8_8_ = 0x8000000000000000;
        local_438._M_dataplus._M_p = (pointer)pvVar9;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&local_438);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_390,
                   (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)&local_438);
        while (bVar4 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_320,
                                    (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_390), !bVar4) {
          psVar11 = nlohmann::detail::
                    iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           *)local_320);
          pcVar2 = (psVar11->_M_dataplus)._M_p;
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,pcVar2,pcVar2 + psVar11->_M_string_length);
          iVar5 = std::__cxx11::string::compare((char *)&local_438);
          if ((iVar5 != 0) &&
             (iVar5 = std::__cxx11::string::compare((char *)&local_438), iVar5 != 0)) {
            pbVar12 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)local_320);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_3f8,pbVar12);
            printf("    %s",local_438._M_dataplus._M_p);
            if (local_438._M_string_length < 0x14) {
              lVar20 = 0;
              do {
                putchar(0x20);
                lVar20 = lVar20 + 1;
              } while (local_438._M_string_length + lVar20 < 0x14);
            }
            __s._M_p = "<empty>";
            if (local_3f8._M_string_length != 0) {
              __s._M_p = local_3f8._M_dataplus._M_p;
            }
            puts(__s._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_320);
          local_300 = local_300 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_p != &local_330) {
          operator_delete(local_340._M_p,local_330._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_p != &local_350) {
          operator_delete(local_360._M_p,local_350._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_p != &local_2c0) {
          operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_p != &local_2e0) {
          operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._0_8_ != &local_458) {
          operator_delete((void *)local_468._0_8_,
                          CONCAT71(local_458._1_7_,local_458._M_local_buf[0]) + 1);
        }
      }
      if (local_480 == 0) {
        printf("\nYour choice: ");
      }
      else {
        printf("\nYour choice (%zu): ");
      }
      local_468._0_8_ = &local_458;
      local_468._8_8_ = 0;
      local_458._M_local_buf[0] = '\0';
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)local_468,cVar3);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._0_8_;
      if ((local_468._8_8_ == 0) && (local_480 != 0)) {
        local_488 = (ulong *)operator_new(8);
        *local_488 = local_480;
LAB_00103fdf:
        uVar8 = (ulong)local_448[0];
        if (local_448[0] != null) {
          if (local_448[0] == object) {
            uVar8 = ((local_440.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          }
          else if (local_448[0] == array) {
            uVar8 = (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          else {
            uVar8 = 1;
          }
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_468._0_8_;
        if (uVar8 < local_480) {
LAB_001044f6:
          fprintf(_stderr,"Invalid choice \'%s\'!\n",paVar18);
        }
        else {
          pvVar9 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                 *)local_448,local_480 - 1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_2a8,pvVar9);
          local_390._8_8_ = (_Base_ptr)0x0;
          local_390._16_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)0x0;
          local_378.m_it = -0x8000000000000000;
          local_390._0_8_ =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_2a8;
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)local_390);
          nlohmann::detail::
          iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_value
                    ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      *)local_320,
                     (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)local_390);
          local_438._M_string_length = 0;
          local_438.field_2._M_allocated_capacity = 0;
          local_438.field_2._8_8_ = 0x8000000000000000;
          local_438._M_dataplus._M_p = (pointer)local_2a8;
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)&local_438);
          nlohmann::detail::
          iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::iteration_proxy_value
                    ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      *)local_390,
                     (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&local_438);
          puVar1 = (undefined1 *)((long)&local_3d8.field_2 + 8);
          while (bVar4 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                       *)local_320,
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                       *)local_390), !bVar4) {
            psVar11 = nlohmann::detail::
                      iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             *)local_320);
            pcVar2 = (psVar11->_M_dataplus)._M_p;
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_438,pcVar2,pcVar2 + psVar11->_M_string_length);
            pbVar12 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)local_320);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_418,pbVar12);
            std::operator+(&local_298,"config \"",&local_438);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
            plVar16 = plVar7 + 2;
            if ((long *)*plVar7 == plVar16) {
              local_3d8.field_2._8_8_ = *plVar16;
              lStack_3b8 = plVar7[3];
              local_3d8._M_string_length = (size_type)puVar1;
            }
            else {
              local_3d8.field_2._8_8_ = *plVar16;
              local_3d8._M_string_length = (size_type)*plVar7;
            }
            local_3d8.field_2._M_allocated_capacity = plVar7[1];
            *plVar7 = (long)plVar16;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_3d8._M_string_length,
                                        (ulong)local_418._M_dataplus._M_p);
            plVar16 = plVar7 + 2;
            if ((long *)*plVar7 == plVar16) {
              local_3a0 = *plVar16;
              lStack_398 = plVar7[3];
              local_3b0 = &local_3a0;
            }
            else {
              local_3a0 = *plVar16;
              local_3b0 = (long *)*plVar7;
            }
            local_3a8 = plVar7[1];
            *plVar7 = (long)plVar16;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_3b0);
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            psVar17 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_3f8.field_2._M_allocated_capacity = *psVar17;
              local_3f8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_3f8.field_2._M_allocated_capacity = *psVar17;
              local_3f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_3f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar17;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            git(&local_3d8);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_3d8._M_dataplus._M_p !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_3d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3d8._M_dataplus._M_p);
            }
            local_3d8._M_dataplus._M_p = (pointer)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_3b0 != &local_3a0) {
              operator_delete(local_3b0,local_3a0 + 1);
            }
            if ((undefined1 *)local_3d8._M_string_length != puVar1) {
              operator_delete((void *)local_3d8._M_string_length,local_3d8.field_2._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
            nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)local_320);
            local_300 = local_300 + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_p != &local_330) {
            operator_delete(local_340._M_p,local_330._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p != &local_350) {
            operator_delete(local_360._M_p,local_350._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_p != &local_2c0) {
            operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_p != &local_2e0) {
            operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_2a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_2a8 + 8),local_2a8[0]);
        }
        operator_delete(local_488,8);
      }
      else {
        if (local_468._8_8_ != 0) {
          sVar15 = 0;
          uVar8 = 0;
          do {
            uVar19 = (int)*(char *)(local_468._0_8_ + sVar15) - 0x30;
            if ((9 < uVar19) || (local_480 = (ulong)uVar19 + uVar8 * 10, local_480 < uVar8))
            goto LAB_001044c7;
            sVar15 = sVar15 + 1;
            uVar8 = local_480;
          } while (local_468._8_8_ != sVar15);
          local_488 = (ulong *)operator_new(8);
          *local_488 = local_480;
          if (local_480 != 0) goto LAB_00103fdf;
          goto LAB_001044f6;
        }
LAB_001044c7:
        fprintf(_stderr,"Invalid choice \'%s\'!\n",local_468._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ != &local_458) {
        operator_delete((void *)local_468._0_8_,
                        CONCAT71(local_458._1_7_,local_458._M_local_buf[0]) + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_448);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_448 + 8),local_448[0]);
    }
    std::ifstream::~ifstream(local_238);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  else {
    if ((local_470 != (undefined1  [8])0x0) && (local_478 != (undefined1  [8])0x0)) {
      iVar5 = 0;
      fprintf(_stderr,"%s <%s>\n",*(undefined8 *)local_470,*(undefined8 *)local_478);
      goto LAB_0010448b;
    }
    main_cold_2();
  }
  iVar5 = 1;
LAB_0010448b:
  if (local_478 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478);
  }
  if (local_470 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_470,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470);
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
{
	auto gitName = git("config --local user.name");
	auto gitEmail = git("config --local user.email");

	if(argc > 1 && strcmp(argv[1], "check") == 0)
	{
		if(gitName && gitEmail)
		{
			fprintf(stderr, "%s <%s>\n", gitName->c_str(), gitEmail->c_str());
			return EXIT_SUCCESS;
		}
		else
		{
			fprintf(stderr, "Name or email not set!\n");
			return EXIT_FAILURE;
		}
	}

	std::string homepath = getenv("HOME");
	auto jsonFilename = "git-identity.json";
	std::ifstream jsonFile(homepath + "/" + jsonFilename);
	if(!jsonFile.is_open())
	{
		fprintf(stderr, "Failed to open '%s'!\n", jsonFilename);
		return EXIT_FAILURE;
	}

	auto json = nlohmann::json::parse(jsonFile);

	size_t defaultChoice = 0;
	for(size_t i = 0; i < json.size(); i++)
	{
		auto& identity = json[i];
		std::string name = identity["user.name"];
		std::string email = identity["user.email"];
		if(gitName && gitEmail && name == *gitName && email == *gitEmail)
			defaultChoice = i + 1;
		printf("(%zu) %s <%s>\n", i + 1, name.c_str(), email.c_str());
		for(auto& el : identity.items())
		{
			std::string key = el.key();
			if(key == "user.name" || key == "user.email")
				continue;
			std::string value = el.value();
			printf("    %s", key.c_str());
			for(size_t i = 0; i + key.length() < 20; i++)
				printf(" ");
			printf("%s\n", value.empty() ? "<empty>" : value.c_str());
		}
	}

	if(defaultChoice)
		printf("\nYour choice (%zu): ", defaultChoice);
	else
		printf("\nYour choice: ");

	std::string choiceStr;
	std::getline(std::cin, choiceStr);

	auto choice = (choiceStr.empty() && defaultChoice > 0) ? std::make_unique<size_t>(defaultChoice) : parseSize(choiceStr);
	if(!choice || *choice == 0 || *choice > json.size())
	{
		fprintf(stderr, "Invalid choice '%s'!\n", choiceStr.c_str());
		return EXIT_FAILURE;
	}

	auto identity = json[*choice - 1];
	for(auto& el : identity.items())
	{
		std::string key = el.key();
		std::string value = el.value();
		git("config \"" + key + "\" \"" + value + "\"");
	}

	return EXIT_FAILURE;
}